

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::init
          (UserDefinedIOCase *this,EVP_PKEY_CTX *ctx)

{
  size_type *psVar1;
  IOType IVar2;
  VertexIOArraySize VVar3;
  IOType IVar4;
  TessControlOutArraySize TVar5;
  pointer pSVar6;
  long *plVar7;
  ContextInfo *pCVar8;
  Context *this_00;
  RenderContext *renderCtx;
  bool bVar9;
  int iVar10;
  RenderTarget *renderTarget;
  IOBlock *pIVar11;
  Variable *pVVar12;
  ShaderProgram *this_01;
  ProgramSources *pPVar13;
  TestError *this_02;
  int precision;
  int precision_00;
  TessPrimitiveType primType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  char *pcVar15;
  long lVar16;
  StructType *structPtr;
  bool bVar17;
  int local_42c;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  blockMembers;
  Variable var1;
  undefined1 local_398 [40];
  VertexIOArraySize local_370;
  allocator<char> local_36b;
  allocator<char> local_36a;
  allocator<char> local_369;
  undefined1 local_368 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  Variable var0;
  string tessellationEvaluationTemplate;
  string fragmentShaderTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string tcsStatements;
  string tesStatements;
  SharedPtr<const_glu::ShaderProgram> local_1a0;
  string tcsDeclarations;
  string vertexAttrArrayInputSize;
  string tesDeclarations;
  string inMaybePatch;
  string outMaybePatch;
  string local_f0 [32];
  value_type local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  IVar2 = this->m_ioType;
  VVar3 = this->m_vertexIOArraySize;
  if (VVar3 == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY) {
    pCVar8 = ((this->super_TestCase).m_context)->m_contextInfo;
    var0.super_TopLevelObject._vptr_TopLevelObject._0_4_ =
         (*pCVar8->_vptr_ContextInfo[2])(pCVar8,0x8e7d);
    de::toString<int>(&vertexAttrArrayInputSize,(int *)&var0);
  }
  else {
    if (VVar3 == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
      pcVar15 = "gl_MaxPatchVertices";
    }
    else {
      if (VVar3 != VERTEX_IO_ARRAY_SIZE_IMPLICIT) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertexAttrArrayInputSize,(char *)0x0,(allocator<char> *)&var1);
        goto LAB_0121a53f;
      }
      pcVar15 = glcts::fixed_sample_locations_values + 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertexAttrArrayInputSize,pcVar15,(allocator<char> *)&var1);
  }
LAB_0121a53f:
  pcVar15 = "patch ";
  if (IO_TYPE_PER_PATCH_BLOCK_ARRAY < IVar2) {
    pcVar15 = glcts::fixed_sample_locations_values + 1;
  }
  psVar1 = &var1.m_name._M_string_length;
  var1.m_name._M_dataplus._M_p = (pointer)0x0;
  var1.m_name._M_string_length._0_1_ = 0;
  var1.super_TopLevelObject._vptr_TopLevelObject = (_func_int **)psVar1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,pcVar15)
  ;
  std::operator+(&outMaybePatch,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,"out ");
  std::__cxx11::string::~string((string *)&var0);
  std::__cxx11::string::~string((string *)&var1);
  var1.m_name._M_dataplus._M_p = (pointer)0x0;
  var1.m_name._M_string_length._0_1_ = 0;
  var1.super_TopLevelObject._vptr_TopLevelObject = (_func_int **)psVar1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,pcVar15)
  ;
  std::operator+(&inMaybePatch,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,"in ");
  std::__cxx11::string::~string((string *)&var0);
  std::__cxx11::string::~string((string *)&var1);
  IVar4 = this->m_ioType;
  tcsDeclarations._M_dataplus._M_p = (pointer)&tcsDeclarations.field_2;
  tcsDeclarations._M_string_length = 0;
  tcsDeclarations.field_2._M_local_buf[0] = '\0';
  tcsStatements._M_dataplus._M_p = (pointer)&tcsStatements.field_2;
  tcsStatements._M_string_length = 0;
  tesDeclarations._M_dataplus._M_p = (pointer)&tesDeclarations.field_2;
  tesDeclarations._M_string_length = 0;
  tcsStatements.field_2._M_local_buf[0] = '\0';
  tesDeclarations.field_2._M_local_buf[0] = '\0';
  tesStatements._M_dataplus._M_p = (pointer)&tesStatements.field_2;
  tesStatements._M_string_length = 0;
  tesStatements.field_2._M_local_buf[0] = '\0';
  glu::StructType::StructType((StructType *)&var0,"S");
  std::vector<glu::StructType,_std::allocator<glu::StructType>_>::emplace_back<glu::StructType>
            (&this->m_structTypes,(StructType *)&var0);
  glu::StructType::~StructType((StructType *)&var0);
  glu::VarType::VarType((VarType *)&tessellationControlTemplate,TYPE_FLOAT,PRECISION_HIGHP);
  structPtr = (this->m_structTypes).
              super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
  glu::VarType::VarType((VarType *)&tessellationEvaluationTemplate,structPtr);
  glu::VarType::VarType((VarType *)&var0,TYPE_INT,PRECISION_HIGHP);
  glu::StructType::addMember(structPtr,"x",(VarType *)&var0);
  glu::VarType::~VarType((VarType *)&var0);
  glu::VarType::VarType((VarType *)&var0,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(structPtr,"y",(VarType *)&var0);
  glu::VarType::~VarType((VarType *)&var0);
  if ((IVar4 < IO_TYPE_LAST & 0x2cU >> ((byte)IVar4 & 0x1f)) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var1,"in_te_s",(allocator<char> *)&blockMembers);
    Variable::Variable(&var0,(string *)&var1,(VarType *)&tessellationEvaluationTemplate,
                       this->m_ioType != IO_TYPE_PER_PATCH);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blockMembers,"in_te_f",(allocator<char> *)local_398);
    Variable::Variable(&var1,(string *)&blockMembers,(VarType *)&tessellationControlTemplate,
                       this->m_ioType != IO_TYPE_PER_PATCH);
    std::__cxx11::string::~string((string *)&blockMembers);
    bVar17 = this->m_ioType != IO_TYPE_PER_PATCH_ARRAY;
    if (bVar17) {
      pVVar12 = (Variable *)operator_new(0x48);
      Variable::Variable(pVVar12,&var0);
      de::
      SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
      ::SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                   *)&blockMembers,(TopLevelObject *)pVVar12);
      std::
      vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
      ::push_back(&this->m_tcsOutputs,(value_type *)&blockMembers);
      de::
      SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
      ::~SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                    *)&blockMembers);
      pVVar12 = (Variable *)operator_new(0x48);
      Variable::Variable(pVVar12,&var0);
      de::
      SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
      ::SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                   *)&blockMembers,(TopLevelObject *)pVVar12);
      std::
      vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
      ::push_back(&this->m_tesInputs,(value_type *)&blockMembers);
      de::
      SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
      ::~SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                    *)&blockMembers);
    }
    pVVar12 = (Variable *)operator_new(0x48);
    Variable::Variable(pVVar12,&var1);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
               *)&blockMembers,(TopLevelObject *)pVVar12);
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tcsOutputs,(value_type *)&blockMembers);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    ~SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                *)&blockMembers);
    pVVar12 = (Variable *)operator_new(0x48);
    Variable::Variable(pVVar12,&var1);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
               *)&blockMembers,(TopLevelObject *)pVVar12);
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tesInputs,(value_type *)&blockMembers);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    ~SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                *)&blockMembers);
    Variable::~Variable(&var1);
    Variable::~Variable(&var0);
  }
  else {
    glu::VarType::VarType((VarType *)&var0,(VarType *)&tessellationControlTemplate,2);
    glu::StructType::addMember(structPtr,"z",(VarType *)&var0);
    glu::VarType::~VarType((VarType *)&var0);
    blockMembers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    blockMembers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    blockMembers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this->m_ioType != IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&var1,"blockS",(allocator<char> *)local_398);
      IOBlock::Member::Member
                ((Member *)&var0,(string *)&var1,(VarType *)&tessellationEvaluationTemplate);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
      ::push_back(&blockMembers,(value_type *)&var0);
      IOBlock::Member::~Member((Member *)&var0);
      std::__cxx11::string::~string((string *)&var1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var1,"blockFa",(allocator<char> *)local_368);
    glu::VarType::VarType((VarType *)local_398,(VarType *)&tessellationControlTemplate,3);
    IOBlock::Member::Member((Member *)&var0,(string *)&var1,(VarType *)local_398);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back(&blockMembers,(value_type *)&var0);
    IOBlock::Member::~Member((Member *)&var0);
    glu::VarType::~VarType((VarType *)local_398);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var1,"blockSa",(allocator<char> *)local_368);
    glu::VarType::VarType((VarType *)local_398,(VarType *)&tessellationEvaluationTemplate,2);
    IOBlock::Member::Member((Member *)&var0,(string *)&var1,(VarType *)local_398);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back(&blockMembers,(value_type *)&var0);
    IOBlock::Member::~Member((Member *)&var0);
    glu::VarType::~VarType((VarType *)local_398);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var1,"blockF",(allocator<char> *)local_398);
    IOBlock::Member::Member((Member *)&var0,(string *)&var1,(VarType *)&tessellationControlTemplate)
    ;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back(&blockMembers,(value_type *)&var0);
    IOBlock::Member::~Member((Member *)&var0);
    std::__cxx11::string::~string((string *)&var1);
    pIVar11 = (IOBlock *)operator_new(0x60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var0,"TheBlock",(allocator<char> *)local_368);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var1,"tcBlock",(allocator<char> *)&vertexShaderTemplate);
    IOBlock::IOBlock(pIVar11,(string *)&var0,(string *)&var1,&blockMembers);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
               *)local_398,(TopLevelObject *)pIVar11);
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tcsOutputs,(value_type *)local_398);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    ~SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                *)local_398);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::~string((string *)&var0);
    pIVar11 = (IOBlock *)operator_new(0x60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var0,"TheBlock",(allocator<char> *)local_368);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var1,"teBlock",(allocator<char> *)&vertexShaderTemplate);
    IOBlock::IOBlock(pIVar11,(string *)&var0,(string *)&var1,&blockMembers);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
               *)local_398,(TopLevelObject *)pIVar11);
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tesInputs,(value_type *)local_398);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    ~SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                *)local_398);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::~string((string *)&var0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::~vector(&blockMembers);
    bVar17 = true;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"in_tc_attr",(allocator<char> *)local_368);
  Variable::Variable(&var0,(string *)local_398,(VarType *)&tessellationControlTemplate,true);
  Variable::declareArray((string *)&blockMembers,&var0,&vertexAttrArrayInputSize);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,"in ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blockMembers)
  ;
  std::__cxx11::string::append((string *)&tcsDeclarations);
  std::__cxx11::string::~string((string *)&var1);
  std::__cxx11::string::~string((string *)&blockMembers);
  Variable::~Variable(&var0);
  std::__cxx11::string::~string((string *)local_398);
  if (bVar17) {
    glu::StructType::StructType((StructType *)&var0,structPtr);
    var0.m_type.m_data.array.size = 0;
    de::toString<glu::decl::DeclareStructType>((string *)&blockMembers,(DeclareStructType *)&var0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &blockMembers,";\n");
    std::__cxx11::string::append((string *)&tcsDeclarations);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::~string((string *)&blockMembers);
    glu::StructType::~StructType((StructType *)&var0);
  }
  std::__cxx11::string::append((char *)&tcsStatements);
  lVar16 = 0;
  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_370 = VVar3;
  while( true ) {
    pSVar6 = (this->m_tcsOutputs).
             super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(int)((ulong)((long)(this->m_tcsOutputs).
                                  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 4)
        <= (long)pbVar14) break;
    plVar7 = *(long **)((long)&pSVar6->m_ptr + lVar16);
    IVar4 = this->m_ioType;
    local_340 = pbVar14;
    if (IVar2 < IO_TYPE_PER_VERTEX) {
      if (IVar4 != IO_TYPE_PER_PATCH) {
        if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
          local_42c = 3;
          goto LAB_0121ae81;
        }
        if (IVar4 != IO_TYPE_PER_PATCH_BLOCK) {
          iVar10 = (uint)(IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 4 + -2;
          goto LAB_0121aeb3;
        }
      }
      (**(code **)(*plVar7 + 0x18))(&var1,plVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     &outMaybePatch,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1);
      std::__cxx11::string::append((string *)&tcsDeclarations);
      std::__cxx11::string::~string((string *)&var0);
      std::__cxx11::string::~string((string *)&var1);
      bVar9 = true;
      local_42c = 1;
    }
    else {
      local_42c = -1;
      iVar10 = -1;
      if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
LAB_0121ae81:
        local_398._0_4_ = TYPE_LAST;
        de::toString<int>((string *)&blockMembers,(int *)local_398);
      }
      else {
LAB_0121aeb3:
        local_42c = iVar10;
        if (IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
          local_368._0_4_ = SHADERTYPE_GEOMETRY;
          de::toString<int>((string *)&blockMembers,(int *)local_368);
        }
        else {
          TVar5 = this->m_tessControlOutArraySize;
          if (TVar5 == TESS_CONTROL_OUT_ARRAY_SIZE_QUERY) {
            pCVar8 = ((this->super_TestCase).m_context)->m_contextInfo;
            fragmentShaderTemplate._M_dataplus._M_p._0_4_ =
                 (*pCVar8->_vptr_ContextInfo[2])(pCVar8,0x8e7d);
            de::toString<int>((string *)&blockMembers,(int *)&fragmentShaderTemplate);
          }
          else if (TVar5 == TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT) {
            vertexShaderTemplate._M_dataplus._M_p._0_4_ = 5;
            de::toString<int>((string *)&blockMembers,(int *)&vertexShaderTemplate);
          }
          else {
            pcVar15 = glcts::fixed_sample_locations_values + 1;
            if (TVar5 == TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN) {
              pcVar15 = "gl_MaxPatchVertices";
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&blockMembers,pcVar15,&local_369);
          }
        }
      }
      (**(code **)(*plVar7 + 0x20))(&var1,plVar7,&blockMembers);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     &outMaybePatch,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1);
      std::__cxx11::string::append((string *)&tcsDeclarations);
      std::__cxx11::string::~string((string *)&var0);
      std::__cxx11::string::~string((string *)&var1);
      std::__cxx11::string::~string((string *)&blockMembers);
      if (IVar2 < IO_TYPE_PER_VERTEX) {
        bVar9 = false;
      }
      else {
        iVar10 = (**(code **)(*plVar7 + 0x38))(plVar7);
        de::floatToString_abi_cxx11_
                  ((string *)&blockMembers,(de *)&DAT_00000001,(float)iVar10 * 0.4,precision);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                       "\t\tv += float(gl_InvocationID)*",(string *)&blockMembers);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                       ";\n");
        std::__cxx11::string::append((string *)&tcsStatements);
        std::__cxx11::string::~string((string *)&var0);
        std::__cxx11::string::~string((string *)&var1);
        std::__cxx11::string::~string((string *)&blockMembers);
        bVar9 = false;
      }
    }
    (**(code **)(*plVar7 + 0x10))
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blockMembers,
               plVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                   "\n\t\t// Assign values to output ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &blockMembers);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,"\n");
    std::__cxx11::string::append((string *)&tcsStatements);
    std::__cxx11::string::~string((string *)&var0);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::~string((string *)&blockMembers);
    if (bVar9) {
      (**(code **)(*plVar7 + 0x30))(&var0,plVar7,2,glslAssignBasicTypeObject);
      std::__cxx11::string::append((string *)&tcsStatements);
    }
    else {
      (**(code **)(*plVar7 + 0x28))(&var0,plVar7,local_42c,2,glslAssignBasicTypeObject);
      std::__cxx11::string::append((string *)&tcsStatements);
    }
    std::__cxx11::string::~string((string *)&var0);
    if (IO_TYPE_PER_PATCH_BLOCK_ARRAY < IVar2) {
      fragmentShaderTemplate._M_dataplus._M_p._0_4_ = 5;
      de::toString<int>((string *)local_368,(int *)&fragmentShaderTemplate);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     "\t\tv += float(",(string *)local_368);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockMembers,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     "-gl_InvocationID-1)*");
      iVar10 = (**(code **)(*plVar7 + 0x38))(plVar7);
      de::floatToString_abi_cxx11_
                (&vertexShaderTemplate,(de *)&DAT_00000001,(float)iVar10 * 0.4,precision_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockMembers,&vertexShaderTemplate);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                     ";\n");
      std::__cxx11::string::append((string *)&tcsStatements);
      std::__cxx11::string::~string((string *)&var0);
      std::__cxx11::string::~string((string *)&var1);
      std::__cxx11::string::~string((string *)&vertexShaderTemplate);
      std::__cxx11::string::~string((string *)&blockMembers);
      std::__cxx11::string::~string((string *)local_398);
      std::__cxx11::string::~string((string *)local_368);
    }
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(local_340->_M_dataplus)._M_p + 1);
    lVar16 = lVar16 + 0x10;
  }
  std::__cxx11::string::append((char *)&tcsStatements);
  VVar3 = local_370;
  if (bVar17) {
    glu::StructType::StructType((StructType *)&var0,structPtr);
    var0.m_type.m_data.array.size = 0;
    de::toString<glu::decl::DeclareStructType>((string *)&blockMembers,(DeclareStructType *)&var0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &blockMembers,";\n");
    std::__cxx11::string::append((string *)&tesDeclarations);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::~string((string *)&blockMembers);
    glu::StructType::~StructType((StructType *)&var0);
  }
  std::__cxx11::string::append((char *)&tesStatements);
  local_370 = VVar3 - VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN;
  lVar16 = 0;
  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    pSVar6 = (this->m_tesInputs).
             super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar15 = (char *)(long)(int)((ulong)((long)(this->m_tesInputs).
                                                super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pSVar6) >> 4);
    if ((long)pcVar15 <= (long)pbVar14) {
      std::__cxx11::string::append((char *)&tesStatements);
      glu::VarType::~VarType((VarType *)&tessellationEvaluationTemplate);
      glu::VarType::~VarType((VarType *)&tessellationControlTemplate);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vertexShaderTemplate,
                 "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
                 ,(allocator<char> *)&var0);
      fragmentShaderTemplate._M_dataplus._M_p._0_4_ = 5;
      de::toString<int>(&tessellationEvaluationTemplate,(int *)&fragmentShaderTemplate);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                     "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                     &tessellationEvaluationTemplate);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                     ") out;\n\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockMembers,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     &tcsDeclarations);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockMembers,
                     "\npatch out highp vec2 in_te_positionScale;\npatch out highp vec2 in_te_positionOffset;\n\nvoid main (void)\n{\n"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                     &tcsStatements);
      std::operator+(&tessellationControlTemplate,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     "\n\tin_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n\tin_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
                    );
      std::__cxx11::string::~string((string *)&var0);
      std::__cxx11::string::~string((string *)&var1);
      std::__cxx11::string::~string((string *)&blockMembers);
      std::__cxx11::string::~string((string *)local_398);
      std::__cxx11::string::~string((string *)local_368);
      std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
      Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
                (&fragmentShaderTemplate,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
                 primType,SUB81(pcVar15,0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                     "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                     &fragmentShaderTemplate);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                     "\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockMembers,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     &tesDeclarations);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockMembers,
                     "\npatch in highp vec2 in_te_positionScale;\npatch in highp vec2 in_te_positionOffset;\n\nout highp vec4 in_f_color;\n// Will contain the index of the first incorrect input,\n// or the number of inputs if all are correct\nflat out highp uint out_te_firstFailedInputIndex;\n\nbool compare_int   (int   a, int   b) { return a == b; }\nbool compare_float (float a, float b) { return abs(a - b) < 0.01f; }\nbool compare_vec4  (vec4  a, vec4  b) { return all(lessThan(abs(a - b), vec4(0.01f))); }\n\nvoid main (void)\n{\n"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                     &tesStatements);
      std::operator+(&tessellationEvaluationTemplate,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     "\n\tgl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n\tin_f_color = allOk ? vec4(0.0, 1.0, 0.0, 1.0)\n\t                   : vec4(1.0, 0.0, 0.0, 1.0);\n\tout_te_firstFailedInputIndex = firstFailedInputIndex;\n}\n"
                    );
      std::__cxx11::string::~string((string *)&var0);
      std::__cxx11::string::~string((string *)&var1);
      std::__cxx11::string::~string((string *)&blockMembers);
      std::__cxx11::string::~string((string *)local_398);
      std::__cxx11::string::~string((string *)local_368);
      std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fragmentShaderTemplate,
                 "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
                 ,(allocator<char> *)&var0);
      this_01 = (ShaderProgram *)operator_new(0xd0);
      this_00 = (this->super_TestCase).m_context;
      renderCtx = this_00->m_renderCtx;
      memset(&var0,0,0xac);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)this_00,
                 (Context *)
                 CONCAT44(vertexShaderTemplate._M_dataplus._M_p._4_4_,
                          vertexShaderTemplate._M_dataplus._M_p._0_4_),pcVar15);
      glu::VertexSource::VertexSource((VertexSource *)&var1,&local_50);
      pPVar13 = glu::ProgramSources::operator<<((ProgramSources *)&var0,(ShaderSource *)&var1);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)tessellationControlTemplate._M_dataplus._M_p,pcVar15);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)&blockMembers,&local_70);
      pPVar13 = glu::ProgramSources::operator<<(pPVar13,(ShaderSource *)&blockMembers);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_90,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,pcVar15);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)local_398,&local_90);
      pPVar13 = glu::ProgramSources::operator<<(pPVar13,(ShaderSource *)local_398);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_b0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 CONCAT44(fragmentShaderTemplate._M_dataplus._M_p._4_4_,
                          (int)fragmentShaderTemplate._M_dataplus._M_p),pcVar15);
      glu::FragmentSource::FragmentSource((FragmentSource *)local_368,&local_b0);
      pPVar13 = glu::ProgramSources::operator<<(pPVar13,(ShaderSource *)local_368);
      std::__cxx11::string::string<std::allocator<char>>
                (local_f0,"out_te_firstFailedInputIndex",&local_36b);
      std::__cxx11::string::string((string *)&local_d0,local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pPVar13->transformFeedbackVaryings,&local_d0);
      pPVar13->transformFeedbackBufferMode = 0x8c8c;
      glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar13);
      de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_1a0,this_01);
      de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_1a0);
      de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_1a0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string((string *)(local_368 + 8));
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)(local_398 + 8));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string
                ((string *)
                 &blockMembers.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&var1.m_name);
      std::__cxx11::string::~string((string *)&local_50);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&var0);
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      (this->m_program).m_ptr);
      if ((((this->m_program).m_ptr)->m_program).m_info.linkOk == false) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"Program compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0x183e);
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
      std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
      std::__cxx11::string::~string((string *)&tessellationControlTemplate);
      std::__cxx11::string::~string((string *)&vertexShaderTemplate);
      std::__cxx11::string::~string((string *)&tesStatements);
      std::__cxx11::string::~string((string *)&tesDeclarations);
      std::__cxx11::string::~string((string *)&tcsStatements);
      std::__cxx11::string::~string((string *)&tcsDeclarations);
      std::__cxx11::string::~string((string *)&inMaybePatch);
      std::__cxx11::string::~string((string *)&outMaybePatch);
      iVar10 = std::__cxx11::string::~string((string *)&vertexAttrArrayInputSize);
      return iVar10;
    }
    plVar7 = *(long **)((long)&pSVar6->m_ptr + lVar16);
    IVar4 = this->m_ioType;
    local_340 = pbVar14;
    if (IVar2 < IO_TYPE_PER_VERTEX) {
      if (IVar4 != IO_TYPE_PER_PATCH) {
        if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
          local_42c = 3;
          goto LAB_0121b3a0;
        }
        if (IVar4 != IO_TYPE_PER_PATCH_BLOCK) {
          local_42c = (uint)(IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 4 + -2;
          goto LAB_0121b3d2;
        }
      }
      (**(code **)(*plVar7 + 0x18))(&var1,plVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     &inMaybePatch,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1);
      std::__cxx11::string::append((string *)&tesDeclarations);
      std::__cxx11::string::~string((string *)&var0);
      std::__cxx11::string::~string((string *)&var1);
      bVar17 = true;
      local_42c = 1;
    }
    else {
      local_42c = 5;
      if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
LAB_0121b3a0:
        local_398._0_4_ = TYPE_LAST;
        de::toString<int>((string *)&blockMembers,(int *)local_398);
      }
      else {
LAB_0121b3d2:
        if (IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
          local_368._0_4_ = SHADERTYPE_GEOMETRY;
          de::toString<int>((string *)&blockMembers,(int *)local_368);
        }
        else if (local_370 < 2) {
          de::toString<std::__cxx11::string>
                    ((string *)&blockMembers,(de *)&vertexAttrArrayInputSize,pbVar14);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&blockMembers,glcts::fixed_sample_locations_values + 1,&local_36a);
        }
      }
      (**(code **)(*plVar7 + 0x20))(&var1,plVar7,&blockMembers);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                     &inMaybePatch,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1);
      std::__cxx11::string::append((string *)&tesDeclarations);
      std::__cxx11::string::~string((string *)&var0);
      std::__cxx11::string::~string((string *)&var1);
      std::__cxx11::string::~string((string *)&blockMembers);
      bVar17 = false;
    }
    (**(code **)(*plVar7 + 0x10))
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blockMembers,
               plVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                   "\n\t\t// Check values in input ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &blockMembers);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,"\n");
    std::__cxx11::string::append((string *)&tesStatements);
    std::__cxx11::string::~string((string *)&var0);
    std::__cxx11::string::~string((string *)&var1);
    std::__cxx11::string::~string((string *)&blockMembers);
    if (bVar17) {
      (**(code **)(*plVar7 + 0x30))(&var0,plVar7,2,glslCheckBasicTypeObject);
      std::__cxx11::string::append((string *)&tesStatements);
    }
    else {
      (**(code **)(*plVar7 + 0x28))(&var0,plVar7,local_42c,2,glslCheckBasicTypeObject);
      std::__cxx11::string::append((string *)&tesStatements);
    }
    std::__cxx11::string::~string((string *)&var0);
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(local_340->_M_dataplus)._M_p + 1);
    lVar16 = lVar16 + 0x10;
  } while( true );
}

Assistant:

void UserDefinedIOCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const bool			isPerPatchIO				= m_ioType == IO_TYPE_PER_PATCH				||
													  m_ioType == IO_TYPE_PER_PATCH_ARRAY		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	const bool			isExplicitVertexArraySize	= m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN ||
													  m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY;

	const string		vertexAttrArrayInputSize	= m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_IMPLICIT					? ""
													: m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	? "gl_MaxPatchVertices"
													: m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY			? de::toString(m_context.getContextInfo().getInt(GL_MAX_PATCH_VERTICES))
													: DE_NULL;

	const char* const	maybePatch					= isPerPatchIO ? "patch " : "";
	const string		outMaybePatch				= string() + maybePatch + "out ";
	const string		inMaybePatch				= string() + maybePatch + "in ";
	const bool			useBlock					= m_ioType == IO_TYPE_PER_VERTEX_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	string				tcsDeclarations;
	string				tcsStatements;

	string				tesDeclarations;
	string				tesStatements;

	{
		m_structTypes.push_back(glu::StructType("S"));

		const glu::VarType	highpFloat		(glu::TYPE_FLOAT, glu::PRECISION_HIGHP);
		glu::StructType&	structType		= m_structTypes.back();
		const glu::VarType	structVarType	(&structType);
		bool				usedStruct		= false;

		structType.addMember("x", glu::VarType(glu::TYPE_INT, glu::PRECISION_HIGHP));
		structType.addMember("y", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		if (useBlock)
		{
			// It is illegal to have a structure containing an array as an output variable
			structType.addMember("z", glu::VarType(highpFloat, 2));
		}

		if (useBlock)
		{
			const bool				useLightweightBlock = (m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY); // use leaner block to make sure it is not larger than allowed (per-patch storage is very limited)
			vector<IOBlock::Member>	blockMembers;

			if (!useLightweightBlock)
				blockMembers.push_back(IOBlock::Member("blockS",	structVarType));

			blockMembers.push_back(IOBlock::Member("blockFa",	glu::VarType(highpFloat, 3)));
			blockMembers.push_back(IOBlock::Member("blockSa",	glu::VarType(structVarType, 2)));
			blockMembers.push_back(IOBlock::Member("blockF",	highpFloat));

			m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "tcBlock", blockMembers)));
			m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "teBlock", blockMembers)));

			usedStruct = true;
		}
		else
		{
			const Variable var0("in_te_s", structVarType,	m_ioType != IO_TYPE_PER_PATCH);
			const Variable var1("in_te_f", highpFloat,		m_ioType != IO_TYPE_PER_PATCH);

			if (m_ioType != IO_TYPE_PER_PATCH_ARRAY)
			{
				// Arrays of structures are disallowed, add struct cases only if not arrayed variable
				m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var0)));
				m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var0)));

				usedStruct = true;
			}

			m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var1)));
			m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var1)));
		}

		tcsDeclarations += "in " + Variable("in_tc_attr", highpFloat, true).declareArray(vertexAttrArrayInputSize);

		if (usedStruct)
			tcsDeclarations += de::toString(glu::declare(structType)) + ";\n";

		tcsStatements += "\t{\n"
						 "\t\thighp float v = 1.3;\n";

		for (int tcsOutputNdx = 0; tcsOutputNdx < (int)m_tcsOutputs.size(); tcsOutputNdx++)
		{
			const TopLevelObject&	output		= *m_tcsOutputs[tcsOutputNdx];
			const int				numElements	= !isPerPatchIO								? -1	//!< \note -1 means indexing with gl_InstanceID
												: m_ioType == IO_TYPE_PER_PATCH				? 1
												: m_ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: -2;
			const bool				isArray		= (numElements != 1);

			DE_ASSERT(numElements != -2);

			if (isArray)
			{
				tcsDeclarations += outMaybePatch + output.declareArray(m_ioType == IO_TYPE_PER_PATCH_ARRAY											? de::toString(int(NUM_PER_PATCH_ARRAY_ELEMS))
																	   : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY									? de::toString(int(NUM_PER_PATCH_BLOCKS))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT			? de::toString(int(NUM_OUTPUT_VERTICES))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_QUERY				? de::toString(m_context.getContextInfo().getInt(GL_MAX_PATCH_VERTICES))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN	? "gl_MaxPatchVertices"
																	   : "");
			}
			else
				tcsDeclarations += outMaybePatch + output.declare();

			if (!isPerPatchIO)
				tcsStatements += "\t\tv += float(gl_InvocationID)*" + de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) + ";\n";

			tcsStatements += "\n\t\t// Assign values to output " + output.name() + "\n";
			if (isArray)
				tcsStatements += output.glslTraverseBasicTypeArray(numElements, 2, glslAssignBasicTypeObject);
			else
				tcsStatements += output.glslTraverseBasicType(2, glslAssignBasicTypeObject);

			if (!isPerPatchIO)
				tcsStatements += "\t\tv += float(" + de::toString(int(NUM_OUTPUT_VERTICES)) + "-gl_InvocationID-1)*" + de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) + ";\n";
		}
		tcsStatements += "\t}\n";

		if (usedStruct)
			tesDeclarations += de::toString(glu::declare(structType)) + ";\n";

		tesStatements += "\tbool allOk = true;\n"
						 "\thighp uint firstFailedInputIndex = 0u;\n"
						 "\t{\n"
						 "\t\thighp float v = 1.3;\n";
		for (int tesInputNdx = 0; tesInputNdx < (int)m_tesInputs.size(); tesInputNdx++)
		{
			const TopLevelObject&	input		= *m_tesInputs[tesInputNdx];
			const int				numElements	= !isPerPatchIO								? (int)NUM_OUTPUT_VERTICES
												: m_ioType == IO_TYPE_PER_PATCH				? 1
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: -2;
			const bool				isArray		= (numElements != 1);

			DE_ASSERT(numElements != -2);

			if (isArray)
				tesDeclarations += inMaybePatch + input.declareArray(m_ioType == IO_TYPE_PER_PATCH_ARRAY			? de::toString(int(NUM_PER_PATCH_ARRAY_ELEMS))
																	 : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? de::toString(int(NUM_PER_PATCH_BLOCKS))
																	 : isExplicitVertexArraySize					? de::toString(vertexAttrArrayInputSize)
																	 : "");
			else
				tesDeclarations += inMaybePatch + input.declare();

			tesStatements += "\n\t\t// Check values in input " + input.name() + "\n";
			if (isArray)
				tesStatements += input.glslTraverseBasicTypeArray(numElements, 2, glslCheckBasicTypeObject);
			else
				tesStatements += input.glslTraverseBasicType(2, glslCheckBasicTypeObject);
		}
		tesStatements += "\t}\n";
	}

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = " + de::toString(int(NUM_OUTPUT_VERTICES)) + ") out;\n"
												 "\n"
												 + tcsDeclarations +
												 "\n"
												 "patch out highp vec2 in_te_positionScale;\n"
												 "patch out highp vec2 in_te_positionOffset;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tcsStatements +
												 "\n"
												 "	in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
												 "	in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
												 "\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType) +
												 "\n"
												 + tesDeclarations +
												 "\n"
												 "patch in highp vec2 in_te_positionScale;\n"
												 "patch in highp vec2 in_te_positionOffset;\n"
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "// Will contain the index of the first incorrect input,\n"
												 "// or the number of inputs if all are correct\n"
												 "flat out highp uint out_te_firstFailedInputIndex;\n"
												 "\n"
												 "bool compare_int   (int   a, int   b) { return a == b; }\n"
												 "bool compare_float (float a, float b) { return abs(a - b) < 0.01f; }\n"
												 "bool compare_vec4  (vec4  a, vec4  b) { return all(lessThan(abs(a - b), vec4(0.01f))); }\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tesStatements +
												 "\n"
												 "	gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n"
												 "	in_f_color = allOk ? vec4(0.0, 1.0, 0.0, 1.0)\n"
												 "	                   : vec4(1.0, 0.0, 0.0, 1.0);\n"
												 "	out_te_firstFailedInputIndex = firstFailedInputIndex;\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_firstFailedInputIndex")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}